

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O3

int testSaveNullEncDoc(char *xml,char *expect)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *__s1;
  
  uVar2 = xmlReadDoc(xml,0,0,0);
  uVar3 = xmlBufferCreate();
  uVar4 = xmlSaveToBuffer(uVar3,0,0);
  xmlSaveDoc(uVar4,uVar2);
  xmlSaveClose(uVar4);
  __s1 = (char *)xmlBufferContent(uVar3);
  iVar1 = strcmp(__s1,expect);
  if (iVar1 != 0) {
    testSaveNullEncDoc_cold_1();
  }
  xmlBufferFree(uVar3);
  xmlFreeDoc(uVar2);
  return (uint)(iVar1 != 0);
}

Assistant:

static int
testSaveNullEncDoc(const char *xml, const char *expect) {
    xmlDocPtr doc;
    xmlBufferPtr buffer;
    xmlSaveCtxtPtr save;
    const xmlChar *result;
    int err = 0;

    doc = xmlReadDoc(BAD_CAST xml, NULL, NULL, 0);

    buffer = xmlBufferCreate();
    save = xmlSaveToBuffer(buffer, NULL, 0);
    xmlSaveDoc(save, doc);
    xmlSaveClose(save);

    result = xmlBufferContent(buffer);
    if (strcmp((char *) result, expect) != 0) {
        fprintf(stderr, "xmlSave with NULL encodíng failed\n");
        err = 1;
    }

    xmlBufferFree(buffer);
    xmlFreeDoc(doc);

    return err;
}